

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_cache.hpp
# Opt level: O0

shared_ptr<duckdb::CSVStateMachineCache,_true> __thiscall
duckdb::ObjectCache::GetOrCreate<duckdb::CSVStateMachineCache>(ObjectCache *this,string *key)

{
  bool bVar1;
  mapped_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ObjectCacheEntry,_true> *in_RSI;
  element_type *in_RDI;
  shared_ptr<duckdb::CSVStateMachineCache,_true> sVar2;
  shared_ptr<duckdb::ObjectCacheEntry,_true> object;
  iterator entry;
  lock_guard<std::mutex> glock;
  shared_ptr<duckdb::CSVStateMachineCache,_true> *value;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  byte bVar3;
  string local_a0 [39];
  byte local_79;
  string local_78 [48];
  undefined4 local_48;
  undefined1 local_41;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
  local_40 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_true>
  local_28 [5];
  
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff10,
             (mutex_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  local_28[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
               *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),(key_type *)0x17ab7cc
             );
  local_40[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
  bVar1 = ::std::__detail::operator==(local_28,local_40);
  if (bVar1) {
    local_41 = 0;
    make_shared_ptr<duckdb::CSVStateMachineCache>();
    this_00 = ::std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
              ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>_>_>
                            *)in_stack_ffffffffffffff10,
                           (key_type *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08)
                          );
    shared_ptr<duckdb::ObjectCacheEntry,_true>::operator=<duckdb::CSVStateMachineCache,_0>
              (this_00,(shared_ptr<duckdb::CSVStateMachineCache,_true> *)
                       CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
    local_41 = 1;
    local_48 = 1;
  }
  else {
    ::std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ObjectCacheEntry,_true>_>,_false,_true>
                  *)0x17ab8c5);
    shared_ptr<duckdb::ObjectCacheEntry,_true>::shared_ptr
              ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)in_stack_ffffffffffffff10,
               (shared_ptr<duckdb::ObjectCacheEntry,_true> *)
               CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    bVar1 = duckdb::shared_ptr::operator_cast_to_bool
                      ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)0x17ab8e8);
    local_79 = 0;
    bVar3 = 1;
    if (bVar1) {
      in_stack_ffffffffffffff10 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           shared_ptr<duckdb::ObjectCacheEntry,_true>::operator->
                     ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)in_stack_ffffffffffffff10);
      (*(*(_func_int ***)in_stack_ffffffffffffff10)[2])(local_78);
      local_79 = 1;
      CSVStateMachineCache::ObjectType_abi_cxx11_();
      bVar3 = ::std::operator!=(in_stack_ffffffffffffff10,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
      ::std::__cxx11::string::~string(local_a0);
    }
    if ((local_79 & 1) != 0) {
      ::std::__cxx11::string::~string(local_78);
    }
    if ((bVar3 & 1) == 0) {
      shared_ptr<duckdb::ObjectCacheEntry,_true>::shared_ptr
                ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)in_stack_ffffffffffffff10,
                 (shared_ptr<duckdb::ObjectCacheEntry,_true> *)
                 CONCAT17(bVar3,in_stack_ffffffffffffff08));
      shared_ptr_cast<duckdb::ObjectCacheEntry,duckdb::CSVStateMachineCache>(in_RSI);
      shared_ptr<duckdb::ObjectCacheEntry,_true>::~shared_ptr
                ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)0x17aba28);
    }
    else {
      shared_ptr<duckdb::CSVStateMachineCache,_true>::shared_ptr
                ((shared_ptr<duckdb::CSVStateMachineCache,_true> *)in_stack_ffffffffffffff10,
                 (nullptr_t)CONCAT17(bVar3,in_stack_ffffffffffffff08));
    }
    local_48 = 1;
    shared_ptr<duckdb::ObjectCacheEntry,_true>::~shared_ptr
              ((shared_ptr<duckdb::ObjectCacheEntry,_true> *)0x17aba62);
  }
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17aba80);
  sVar2.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = in_RDI;
  return (shared_ptr<duckdb::CSVStateMachineCache,_true>)
         sVar2.internal.super___shared_ptr<duckdb::CSVStateMachineCache,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

shared_ptr<T> GetOrCreate(const string &key, ARGS &&... args) {
		lock_guard<mutex> glock(lock);

		auto entry = cache.find(key);
		if (entry == cache.end()) {
			auto value = make_shared_ptr<T>(args...);
			cache[key] = value;
			return value;
		}
		auto object = entry->second;
		if (!object || object->GetObjectType() != T::ObjectType()) {
			return nullptr;
		}
		return shared_ptr_cast<ObjectCacheEntry, T>(object);
	}